

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

void __thiscall
prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector
          (prevector<33U,_unsigned_char,_unsigned_int,_int> *this,size_type n,uchar *val)

{
  uchar *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  size_type in_stack_00000034;
  prevector<33U,_unsigned_char,_unsigned_int,_int> *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 *puVar1;
  prevector<33U,_unsigned_char,_unsigned_int,_int> *this_00;
  
  this_00 = *(prevector<33U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28);
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined1 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  puVar1 = in_RDI;
  change_capacity(in_stack_00000038,in_stack_00000034);
  *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + in_ESI;
  item_ptr(this_00,(difference_type_conflict)((ulong)puVar1 >> 0x20));
  fill((prevector<33U,_unsigned_char,_unsigned_int,_int> *)
       CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,(ptrdiff_t)in_RDI,(uchar *)0x3b70f9);
  if (*(prevector<33U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit prevector(size_type n, const T& val) {
        change_capacity(n);
        _size += n;
        fill(item_ptr(0), n, val);
    }